

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMetaDataSetString(FmsMetaData mdata,char *mdata_name,char *c_string)

{
  int iVar1;
  FmsMetaData in_RSI;
  undefined4 *in_RDI;
  char *md_data;
  int err;
  size_t local_38;
  char **in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (undefined4 *)0x0) {
    local_4 = 1;
  }
  else {
    local_4 = FmsMetaDataClear(in_RSI);
    if (local_4 == 0) {
      iVar1 = FmsCopyString((char *)(ulong)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (iVar1 == 0) {
        iVar1 = FmsCopyString((char *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                              in_stack_ffffffffffffffd0);
        if (iVar1 == 0) {
          *in_RDI = 2;
          if (in_stack_ffffffffffffffd0 == (char **)0x0) {
            local_38 = 0;
          }
          else {
            local_38 = strlen((char *)in_stack_ffffffffffffffd0);
          }
          *(size_t *)(in_RDI + 4) = local_38;
          *(char ***)(in_RDI + 6) = in_stack_ffffffffffffffd0;
          local_4 = 0;
        }
        else {
          free(in_stack_ffffffffffffffd0);
          local_4 = 2;
        }
      }
      else {
        local_4 = 2;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsMetaDataSetString(FmsMetaData mdata, const char *mdata_name,
                         const char *c_string) {
  if (!mdata) { E_RETURN(1); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  char *md_data;
  if (FmsCopyString(c_string, &md_data)) { E_RETURN(2); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(2); }
  mdata->md_type = FMS_STRING;
  mdata->num_entries = md_data ? strlen(md_data) : 0;
  mdata->data = md_data;
  return 0;
}